

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

void Diligent::VerifyResourceMerge
               (PipelineStateDesc *PSODesc,GLResourceAttribs *ExistingRes,
               GLResourceAttribs *NewResAttribs)

{
  char *local_50;
  char *local_40;
  char *local_30;
  char *local_28;
  GLResourceAttribs *local_20;
  GLResourceAttribs *NewResAttribs_local;
  GLResourceAttribs *ExistingRes_local;
  PipelineStateDesc *PSODesc_local;
  
  local_20 = NewResAttribs;
  NewResAttribs_local = ExistingRes;
  ExistingRes_local = (GLResourceAttribs *)PSODesc;
  if (ExistingRes->ResourceType != NewResAttribs->ResourceType) {
    if ((PSODesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_40 = "";
    }
    else {
      local_40 = (PSODesc->super_DeviceObjectAttribs).Name;
    }
    local_28 = local_40;
    LogError<true,char[18],char_const*,char[51],char_const*,char[229]>
              (false,"VerifyResourceMerge",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x3c,(char (*) [18])"Shader variable \'",&NewResAttribs->Name,
               (char (*) [51])"\' is shared between multiple shaders in pipeline \'",&local_28,
               (char (*) [229])
               "\', but its type varies. A variable shared between multiple shaders must be defined identically in all shaders. Either use separate variables for different shader stages, change resource name or make sure that type is consistent."
              );
  }
  if (NewResAttribs_local->ArraySize != local_20->ArraySize) {
    if (ExistingRes_local->Name == (Char *)0x0) {
      local_50 = "";
    }
    else {
      local_50 = ExistingRes_local->Name;
    }
    local_30 = local_50;
    LogError<true,char[18],char_const*,char[51],char_const*,char[241]>
              (false,"VerifyResourceMerge",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x3f,(char (*) [18])"Shader variable \'",&local_20->Name,
               (char (*) [51])"\' is shared between multiple shaders in pipeline \'",&local_30,
               (char (*) [241])
               "\', but its array size varies. A variable shared between multiple shaders must be defined identically in all shaders. Either use separate variables for different shader stages, change resource name or make sure that array size is consistent."
              );
  }
  return;
}

Assistant:

static void VerifyResourceMerge(const PipelineStateDesc&                    PSODesc,
                                const ShaderResourcesGL::GLResourceAttribs& ExistingRes,
                                const ShaderResourcesGL::GLResourceAttribs& NewResAttribs)
{
#define LOG_RESOURCE_MERGE_ERROR_AND_THROW(PropertyName)                                                          \
    LOG_ERROR_AND_THROW("Shader variable '", NewResAttribs.Name,                                                  \
                        "' is shared between multiple shaders in pipeline '", (PSODesc.Name ? PSODesc.Name : ""), \
                        "', but its " PropertyName " varies. A variable shared between multiple shaders "         \
                        "must be defined identically in all shaders. Either use separate variables for "          \
                        "different shader stages, change resource name or make sure that " PropertyName " is consistent.");

    if (ExistingRes.ResourceType != NewResAttribs.ResourceType)
        LOG_RESOURCE_MERGE_ERROR_AND_THROW("type");

    if (ExistingRes.ArraySize != NewResAttribs.ArraySize)
        LOG_RESOURCE_MERGE_ERROR_AND_THROW("array size");
#undef LOG_RESOURCE_MERGE_ERROR_AND_THROW
}